

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::p_formatter<spdlog::details::scoped_padder>::format
          (p_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *dest_00;
  char *this_00;
  string_view_t view;
  scoped_padder p;
  
  dest_00 = dest;
  scoped_padder::scoped_padder(&p,2,&(this->super_flag_formatter).padinfo_,dest);
  this_00 = "AM";
  if (0xb < tm_time->tm_hour) {
    this_00 = "PM";
  }
  view.size_ = (size_t)dest;
  view.data_ = (char *)0x2;
  fmt_helper::append_string_view((fmt_helper *)this_00,view,dest_00);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }